

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

void __thiscall ShrinkCmd::redo(ShrinkCmd *this)

{
  bool bVar1;
  PatternSelection *this_00;
  Track *this_01;
  TrackRow *pTVar2;
  TrackRow *pTVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  size_t row;
  size_t sVar7;
  int ch;
  Editor ctx;
  Iterator iter;
  long *local_60;
  char local_58;
  ShrinkCmd *local_50;
  Iterator local_48;
  
  Module::edit((Module *)&local_60);
  local_50 = this;
  this_00 = PatternClip::selection(&(this->super_SelectionCmd).mClip);
  PatternSelection::iterator(&local_48,this_00);
  ch = local_48.mStart.super_PatternCursorBase.track;
  if (local_48.mStart.super_PatternCursorBase.track <= local_48.mEnd.super_PatternCursorBase.track)
  {
    do {
      this_01 = PatternModel::getTrack
                          ((local_50->super_SelectionCmd).mModel,
                           (uint)(local_50->super_SelectionCmd).mPattern,ch);
      iVar4 = local_48.mEnd.super_PatternCursorBase.row;
      lVar5 = (long)local_48.mEnd.super_PatternCursorBase.row;
      if (local_48.mEnd.super_PatternCursorBase.row <
          local_48.mStart.super_PatternCursorBase.row + 2) {
        sVar7 = (size_t)(local_48.mStart.super_PatternCursorBase.row + 1);
      }
      else {
        sVar7 = (long)local_48.mStart.super_PatternCursorBase.row + 1;
        row = (long)local_48.mStart.super_PatternCursorBase.row + 2;
        do {
          pTVar3 = trackerboy::Track::operator[](this_01,row);
          pTVar2 = trackerboy::Track::operator[](this_01,sVar7);
          *pTVar2 = *pTVar3;
          row = row + 2;
          sVar7 = sVar7 + 1;
        } while ((long)row <= lVar5);
      }
      iVar6 = (int)sVar7;
      if (iVar6 <= iVar4) {
        sVar7 = (size_t)iVar6;
        iVar4 = (iVar4 - iVar6) + 1;
        do {
          pTVar3 = trackerboy::Track::operator[](this_01,sVar7);
          pTVar3->note = '\0';
          pTVar3->instrumentId = '\0';
          pTVar3->effects = (_Type)0x0;
          sVar7 = sVar7 + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      bVar1 = ch < local_48.mEnd.super_PatternCursorBase.track;
      ch = ch + 1;
    } while (bVar1);
  }
  if (local_58 == '\x01') {
    LOCK();
    lVar5 = *local_60;
    if (lVar5 == 1) {
      *local_60 = 0;
    }
    UNLOCK();
    if (lVar5 != 1) {
      QBasicMutex::unlockInternal();
    }
    local_58 = '\0';
  }
  PatternModel::invalidate
            ((local_50->super_SelectionCmd).mModel,(uint)(local_50->super_SelectionCmd).mPattern,
             true);
  return;
}

Assistant:

void ShrinkCmd::redo() {
    {
        auto ctx = mModel.mModule.edit();
        auto const iter = mClip.selection().iterator();
        for (auto track = iter.trackStart(); track <= iter.trackEnd(); ++track) {
            TU::shrink(mModel.getTrack(mPattern, track), iter.rowStart(), iter.rowEnd());
        }
    }
    mModel.invalidate(mPattern, true);
}